

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O0

void ur_kinematics::forward(double *q,double *T)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double c234;
  double s234;
  double c6;
  double s6;
  double c5;
  double s5;
  double c3;
  double s3;
  double c2;
  double s2;
  double q234;
  double c1;
  double s1;
  double *T_local;
  double *q_local;
  
  dVar2 = sin(*q);
  dVar3 = cos(*q);
  pdVar1 = q + 1;
  dVar8 = *pdVar1;
  dVar4 = sin(*pdVar1);
  dVar5 = cos(*pdVar1);
  pdVar1 = q + 2;
  dVar6 = sin(*pdVar1);
  dVar7 = cos(*pdVar1);
  dVar8 = q[3] + *pdVar1 + dVar8;
  dVar9 = sin(q[4]);
  dVar10 = cos(q[4]);
  dVar11 = sin(q[5]);
  dVar12 = cos(q[5]);
  dVar13 = sin(dVar8);
  dVar8 = cos(dVar8);
  *T = -dVar10 * dVar2 + ((dVar3 * dVar8 + -(dVar2 * dVar13)) * dVar9) / 2.0 +
       ((dVar3 * dVar8 + dVar2 * dVar13) * dVar9) / 2.0;
  T[1] = dVar12 * (dVar2 * dVar9 + ((dVar3 * dVar8 + -(dVar2 * dVar13)) * dVar10) / 2.0 +
                  ((dVar3 * dVar8 + dVar2 * dVar13) * dVar10) / 2.0) +
         -((dVar11 * ((dVar2 * dVar8 + dVar3 * dVar13) - (dVar2 * dVar8 + -(dVar3 * dVar13)))) / 2.0
          );
  T[2] = -dVar11 * (dVar2 * dVar9 + ((dVar3 * dVar8 + -(dVar2 * dVar13)) * dVar10) / 2.0 +
                   ((dVar3 * dVar8 + dVar2 * dVar13) * dVar10) / 2.0) +
         -(dVar12 * ((dVar2 * dVar8 + dVar3 * dVar13) - (dVar2 * dVar8 + -(dVar3 * dVar13)))) / 2.0;
  T[3] = dVar3 * -0.39225 * dVar4 * dVar6 +
         -(dVar3 * -0.39225 * dVar5) * dVar7 +
         -(dVar10 * 0.0996) * dVar2 +
         -(dVar3 * -0.425) * dVar5 +
         dVar2 * -0.1333 +
         (((dVar2 * dVar8 + -(dVar3 * dVar13)) * 0.0997) / 2.0 -
         ((dVar2 * dVar8 + dVar3 * dVar13) * 0.0997) / 2.0) +
         ((dVar3 * dVar8 + -(dVar2 * dVar13)) * 0.0996 * dVar9) / 2.0 +
         ((dVar3 * dVar8 + dVar2 * dVar13) * 0.0996 * dVar9) / 2.0;
  T[4] = dVar3 * dVar10 + ((dVar2 * dVar8 + dVar3 * dVar13) * dVar9) / 2.0 +
         ((dVar2 * dVar8 + -(dVar3 * dVar13)) * dVar9) / 2.0;
  T[5] = dVar12 * (-dVar3 * dVar9 + ((dVar2 * dVar8 + dVar3 * dVar13) * dVar10) / 2.0 +
                  ((dVar2 * dVar8 + -(dVar3 * dVar13)) * dVar10) / 2.0) +
         dVar11 * ((dVar3 * dVar8 + -(dVar2 * dVar13)) / 2.0 -
                  (dVar3 * dVar8 + dVar2 * dVar13) / 2.0);
  T[6] = dVar12 * ((dVar3 * dVar8 + -(dVar2 * dVar13)) / 2.0 -
                  (dVar3 * dVar8 + dVar2 * dVar13) / 2.0) +
         -(dVar11 * (-dVar3 * dVar9 + ((dVar2 * dVar8 + dVar3 * dVar13) * dVar10) / 2.0 +
                    ((dVar2 * dVar8 + -(dVar3 * dVar13)) * dVar10) / 2.0));
  T[7] = dVar2 * -0.39225 * dVar4 * dVar6 +
         -(dVar5 * -0.39225 * dVar7) * dVar2 +
         -(dVar5 * -0.425) * dVar2 +
         dVar3 * 0.0996 * dVar10 +
         dVar3 * 0.1333 +
         (((dVar3 * dVar8 + -(dVar2 * dVar13)) * 0.0997) / 2.0 -
         ((dVar3 * dVar8 + dVar2 * dVar13) * 0.0997) / 2.0) +
         ((dVar2 * dVar8 + dVar3 * dVar13) * 0.0996 * dVar9) / 2.0 +
         ((dVar2 * dVar8 + -(dVar3 * dVar13)) * 0.0996 * dVar9) / 2.0;
  T[8] = (dVar8 * dVar10 + -(dVar13 * dVar9)) / 2.0 - (dVar8 * dVar10 + dVar13 * dVar9) / 2.0;
  T[9] = -(dVar13 * dVar10) * dVar12 +
         ((dVar13 * dVar12 + -(dVar8 * dVar11)) / 2.0 - (dVar13 * dVar12 + dVar8 * dVar11) / 2.0);
  T[10] = (dVar13 * dVar10 * dVar11 + -((dVar8 * dVar12 + dVar13 * dVar11) / 2.0)) -
          (dVar8 * dVar12 + -(dVar13 * dVar11)) / 2.0;
  T[0xb] = dVar8 * -0.0997 +
           ((dVar4 * -0.425 +
            (dVar4 * dVar7 + dVar5 * dVar6) * -0.39225 +
            ((dVar8 * dVar10 + -(dVar13 * dVar9)) * 0.0996) / 2.0 + 0.1625) -
           ((dVar8 * dVar10 + dVar13 * dVar9) * 0.0996) / 2.0);
  T[0xc] = 0.0;
  T[0xd] = 0.0;
  T[0xe] = 0.0;
  T[0xf] = 1.0;
  return;
}

Assistant:

void forward(const double* q, double* T) {
    double s1 = sin(*q), c1 = cos(*q); q++;
    double q234 = *q, s2 = sin(*q), c2 = cos(*q); q++;
    double s3 = sin(*q), c3 = cos(*q); q234 += *q; q++;
    q234 += *q; q++;
    double s5 = sin(*q), c5 = cos(*q); q++;
    double s6 = sin(*q), c6 = cos(*q);
    double s234 = sin(q234), c234 = cos(q234);
    *T = ((c1*c234-s1*s234)*s5)/2.0 - c5*s1 + ((c1*c234+s1*s234)*s5)/2.0; T++;
    *T = (c6*(s1*s5 + ((c1*c234-s1*s234)*c5)/2.0 + ((c1*c234+s1*s234)*c5)/2.0) -
          (s6*((s1*c234+c1*s234) - (s1*c234-c1*s234)))/2.0); T++;
    *T = (-(c6*((s1*c234+c1*s234) - (s1*c234-c1*s234)))/2.0 -
          s6*(s1*s5 + ((c1*c234-s1*s234)*c5)/2.0 + ((c1*c234+s1*s234)*c5)/2.0)); T++;
    *T = ((d5*(s1*c234-c1*s234))/2.0 - (d5*(s1*c234+c1*s234))/2.0 -
          d4*s1 + (d6*(c1*c234-s1*s234)*s5)/2.0 + (d6*(c1*c234+s1*s234)*s5)/2.0 -
          a2*c1*c2 - d6*c5*s1 - a3*c1*c2*c3 + a3*c1*s2*s3); T++;
    *T = c1*c5 + ((s1*c234+c1*s234)*s5)/2.0 + ((s1*c234-c1*s234)*s5)/2.0; T++;
    *T = (c6*(((s1*c234+c1*s234)*c5)/2.0 - c1*s5 + ((s1*c234-c1*s234)*c5)/2.0) +
          s6*((c1*c234-s1*s234)/2.0 - (c1*c234+s1*s234)/2.0)); T++;
    *T = (c6*((c1*c234-s1*s234)/2.0 - (c1*c234+s1*s234)/2.0) -
          s6*(((s1*c234+c1*s234)*c5)/2.0 - c1*s5 + ((s1*c234-c1*s234)*c5)/2.0)); T++;
    *T = ((d5*(c1*c234-s1*s234))/2.0 - (d5*(c1*c234+s1*s234))/2.0 + d4*c1 +
          (d6*(s1*c234+c1*s234)*s5)/2.0 + (d6*(s1*c234-c1*s234)*s5)/2.0 + d6*c1*c5 -
          a2*c2*s1 - a3*c2*c3*s1 + a3*s1*s2*s3); T++;
    *T = ((c234*c5-s234*s5)/2.0 - (c234*c5+s234*s5)/2.0); T++;
    *T = ((s234*c6-c234*s6)/2.0 - (s234*c6+c234*s6)/2.0 - s234*c5*c6); T++;
    *T = (s234*c5*s6 - (c234*c6+s234*s6)/2.0 - (c234*c6-s234*s6)/2.0); T++;
    *T = (d1 + (d6*(c234*c5-s234*s5))/2.0 + a3*(s2*c3+c2*s3) + a2*s2 -
         (d6*(c234*c5+s234*s5))/2.0 - d5*c234); T++;
    *T = 0.0; T++; *T = 0.0; T++; *T = 0.0; T++; *T = 1.0;
  }